

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O0

int Llb_ManModelCheckAigWithHints(Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars)

{
  long lVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  int RetValue;
  int Entry;
  int i;
  Vec_Int_t *vHFCands;
  Vec_Int_t *vHints;
  DdManager *ddGlo;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAigGlo_local;
  
  vHints = (Vec_Int_t *)0x0;
  clk._4_4_ = -1;
  ddGlo = (DdManager *)pPars;
  pPars_local = (Gia_ParLlb_t *)pAigGlo;
  aVar3 = Abc_Clock();
  if (*(int *)((long)&(ddGlo->sentinel).next + 4) < 1) {
    __assert_fail("pPars->nHintDepth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Hint.c"
                  ,0xa9,"int Llb_ManModelCheckAigWithHints(Aig_Man_t *, Gia_ParLlb_t *)");
  }
  _Entry = Llb_ManCollectHighFanoutObjects
                     ((Aig_Man_t *)pPars_local,
                      *(int *)((long)&(ddGlo->sentinel).next + 4) + *(int *)&(ddGlo->sentinel).type,
                      1);
  iVar2 = Aig_ManObjNumMax((Aig_Man_t *)pPars_local);
  vHFCands = Vec_IntStartFull(iVar2);
  for (RetValue = *(int *)&(ddGlo->sentinel).type; iVar2 = Vec_IntSize(_Entry), RetValue < iVar2;
      RetValue = RetValue + 1) {
    iVar2 = Vec_IntEntry(_Entry,RetValue);
    Vec_IntWriteEntry(vHFCands,iVar2,1);
    clk._4_4_ = Llb_ManModelCheckAig
                          ((Aig_Man_t *)pPars_local,(Gia_ParLlb_t *)ddGlo,vHFCands,
                           (DdManager **)&vHints);
    if (clk._4_4_ == 0) goto LAB_00aab114;
    if (clk._4_4_ == 1) break;
  }
  if (clk._4_4_ != -1) {
    for (; *(int *)&(ddGlo->sentinel).type <= RetValue; RetValue = RetValue + -1) {
      iVar2 = Vec_IntEntry(_Entry,RetValue);
      Vec_IntWriteEntry(vHFCands,iVar2,-1);
      clk._4_4_ = Llb_ManModelCheckAig
                            ((Aig_Man_t *)pPars_local,(Gia_ParLlb_t *)ddGlo,vHFCands,
                             (DdManager **)&vHints);
      if ((clk._4_4_ == 0) || (clk._4_4_ != 1)) break;
    }
  }
LAB_00aab114:
  if (vHints != (Vec_Int_t *)0x0) {
    lVar1._0_4_ = vHints[0x2e].nCap;
    lVar1._4_4_ = vHints[0x2e].nSize;
    if (lVar1 != 0) {
      Cudd_RecursiveDeref((DdManager *)vHints,*(DdNode **)(vHints + 0x2e));
    }
    Extra_StopManager((DdManager *)vHints);
  }
  Vec_IntFreeP((Vec_Int_t **)&Entry);
  Vec_IntFreeP(&vHFCands);
  if (*(int *)&ddGlo->minusinfinity != 0) {
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Total runtime",aVar4 - aVar3);
  }
  return clk._4_4_;
}

Assistant:

int Llb_ManModelCheckAigWithHints( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars )
{
    DdManager * ddGlo = NULL;
    Vec_Int_t * vHints;
    Vec_Int_t * vHFCands;
    int i, Entry, RetValue = -1;
    abctime clk = Abc_Clock();
    assert( pPars->nHintDepth > 0 );
/*
    // perform reachability without hints
    RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, NULL, NULL );
    if ( RetValue >= 0 )
        return RetValue;
*/
    // create hints representation
    vHFCands = Llb_ManCollectHighFanoutObjects( pAigGlo, pPars->nHintDepth+pPars->HintFirst, 1 );
    vHints   = Vec_IntStartFull( Aig_ManObjNumMax(pAigGlo) );
    // add one hint at a time till the problem is solved
    Vec_IntForEachEntryStart( vHFCands, Entry, i, pPars->HintFirst )
    {
        Vec_IntWriteEntry( vHints, Entry, 1 );   // change to 1 to start from zero cof!!!
        // solve under hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            break;
    }
    if ( RetValue == -1 )
        goto Finish;
    // undo the hints one at a time
    for ( ; i >= pPars->HintFirst; i-- )
    {
        Entry = Vec_IntEntry( vHFCands, i );
        Vec_IntWriteEntry( vHints, Entry, -1 );        
        // solve under relaxed hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            continue;
        break;
    }
Finish:
    if ( ddGlo )
    {
        if ( ddGlo->bFunc )
            Cudd_RecursiveDeref( ddGlo, ddGlo->bFunc ); 
        Extra_StopManager( ddGlo );
    }
    Vec_IntFreeP( &vHFCands );
    Vec_IntFreeP( &vHints );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    return RetValue;
}